

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O3

double __thiscall ON_OBSOLETE_V5_DimOrdinate::KinkOffset(ON_OBSOLETE_V5_DimOrdinate *this,int index)

{
  if (index == 1) {
    return this->m_kink_offset_1;
  }
  if (index == 0) {
    return this->m_kink_offset_0;
  }
  return -1.23432101234321e+308;
}

Assistant:

double ON_OBSOLETE_V5_DimOrdinate::KinkOffset( int index) const
{
  if( index == 0)
    return m_kink_offset_0;
  else if( index == 1)
    return m_kink_offset_1;
  else
    return ON_UNSET_VALUE;
}